

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O0

void __thiscall MDIOAnalyzer::ProcessRegAddrDevTypeFrame(MDIOAnalyzer *this)

{
  element_type *peVar1;
  long local_68;
  Frame frame;
  BitState local_3c;
  uint local_38;
  BitState bit;
  U32 i;
  U64 local_28;
  U64 value;
  DataBuilder opcode;
  U64 starting_sample;
  MDIOAnalyzer *this_local;
  
  _opcode = AnalyzerChannelData::GetSampleNumber();
  _opcode = _opcode + 1;
  DataBuilder::DataBuilder((DataBuilder *)&value);
  DataBuilder::Reset((ulonglong *)&value,(ShiftOrder)&local_28,0);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
    GetBit(this,&local_3c,&this->mMdcPosedgeArrows);
    DataBuilder::AddBit((BitState)&value);
  }
  Frame::Frame((Frame *)&local_68);
  if ((this->mCurrentPacket).clause != MDIO_C22_PACKET) {
    GetDevType(this,&local_28);
  }
  local_68 = _opcode;
  _frame = AnalyzerChannelData::GetSampleNumber();
  peVar1 = std::auto_ptr<MDIOAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddFrame((Frame *)peVar1);
  Analyzer::ReportProgress((ulonglong)this);
  Frame::~Frame((Frame *)&local_68);
  DataBuilder::~DataBuilder((DataBuilder *)&value);
  return;
}

Assistant:

void MDIOAnalyzer::ProcessRegAddrDevTypeFrame()
{
    // starting sample of the start frame
    U64 starting_sample = mMdio->GetSampleNumber() + 1;

    // get the value of the 5 bits of register address or devtype frame
    DataBuilder opcode;
    U64 value;
    opcode.Reset( &value, AnalyzerEnums::MsbFirst, 5 );
    for( U32 i = 0; i < 5; ++i )
    {
        BitState bit;
        GetBit( bit, mMdcPosedgeArrows );
        opcode.AddBit( bit );
    }

    // create and set the phyaddr frame
    Frame frame;
    if( mCurrentPacket.clause == MDIO_C22_PACKET )
    {
        frame.mType = MDIO_C22_REGADDR;
    }
    else
    {
        frame.mType = GetDevType( value );
    }
    frame.mData1 = value;
    frame.mFlags = 0;
    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = mMdio->GetSampleNumber();

    mResults->AddFrame( frame );
    ReportProgress( frame.mEndingSampleInclusive );
}